

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __cxxabiv1::anon_unknown_0::parse_noexcept_expression<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  pointer psVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_90;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_70;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_50;
  
  pcVar4 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(first,last,db);
  if ((pcVar4 != first) &&
     (psVar3 = (db->names).
               super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
               ._M_impl.super__Vector_impl_data._M_finish,
     (db->names).
     super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
     ._M_impl.super__Vector_impl_data._M_start != psVar3)) {
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_70,psVar3 + -1);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::replace(&local_70,0,0,"noexcept (",10);
    paVar1 = &local_90.field_2;
    paVar2 = &local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_70._M_dataplus._M_p == paVar2) {
      local_90.field_2._8_8_ = local_70.field_2._8_8_;
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90._M_dataplus._M_p = local_70._M_dataplus._M_p;
    }
    local_90.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
    local_90._M_string_length = local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::append(&local_90,")");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_90._M_dataplus._M_p == paVar1) {
      local_50.field_2._8_8_ = local_90.field_2._8_8_;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50._M_dataplus._M_p = local_90._M_dataplus._M_p;
    }
    local_50._M_string_length = local_90._M_string_length;
    local_90._M_string_length = 0;
    local_90.field_2._M_allocated_capacity =
         (ulong)(uint7)local_90.field_2._M_allocated_capacity._1_7_ << 8;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::operator=(&(db->names).
                 super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      free(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      free(local_90._M_dataplus._M_p);
    }
    first = pcVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      free(local_70._M_dataplus._M_p);
    }
  }
  return first;
}

Assistant:

const char*
parse_noexcept_expression(const char* first, const char* last, C& db)
{
    const char* t1 = parse_expression(first, last, db);
    if (t1 != first)
    {
        if (db.names.empty())
            return first;
        db.names.back().first =  "noexcept (" + db.names.back().move_full() + ")";
        first = t1;
    }
    return first;
}